

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

bool __thiscall CoreML::RangeValue::operator<=(RangeValue *this,RangeValue *other)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  RangeValue *other_local;
  RangeValue *this_local;
  
  bVar2 = isUnbound(other);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else if ((this->_isUnbound & 1U) == 0) {
    uVar1 = this->_val;
    sVar3 = value(other);
    this_local._7_1_ = uVar1 <= sVar3;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RangeValue::operator<= (const RangeValue& other) const {
    if (other.isUnbound())
        return true;
    else if (_isUnbound)
        return false;
    else
        return (_val <= other.value());
}